

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

bool __thiscall Controller::removeGraphic(Controller *this)

{
  BoardMode BVar1;
  
  std::__uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>::reset
            ((__uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_> *)
             &this->imageProvider,(pointer)0x0);
  BVar1 = Board::getMode((this->board)._M_t.
                         super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                         super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                         super__Head_base<0UL,_Board_*,_false>._M_head_impl);
  if (BVar1 == GRAPHIC) {
    Board::setMode((this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t
                   .super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                   super__Head_base<0UL,_Board_*,_false>._M_head_impl,NUMERIC);
  }
  return BVar1 == GRAPHIC;
}

Assistant:

bool Controller::removeGraphic()
{
    imageProvider.reset();

    if ( board->getMode() == BoardMode::GRAPHIC )
    {
        board->setMode( BoardMode::NUMERIC );
        return true;
    }
    return false;
}